

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512bw_blend_popcnt_unroll4(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  auVar10 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
  auVar11 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
  uVar5 = 0;
  while (uVar1 = uVar5 + 4, uVar1 <= len >> 5) {
    auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20 + 0x20));
    auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20));
    auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20 + 0x60));
    auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20 + 0x40));
    lVar4 = 0x20;
    auVar16 = vpsllw_avx512bw(auVar12,8);
    auVar12 = vpsrlw_avx512bw(auVar12,8);
    auVar16 = vpternlogd_avx512f(auVar16,auVar10,auVar13,0xf8);
    auVar12 = vpternlogd_avx512f(auVar12,auVar11,auVar13,0xf8);
    auVar13 = vpsllw_avx512bw(auVar14,8);
    auVar14 = vpsrlw_avx512bw(auVar14,8);
    auVar13 = vpternlogd_avx512f(auVar13,auVar10,auVar15,0xf8);
    auVar14 = vpternlogd_avx512f(auVar14,auVar11,auVar15,0xf8);
    for (; uVar5 = uVar1, lVar4 != 0; lVar4 = lVar4 + -4) {
      uVar6 = vpmovb2m_avx512bw(auVar16);
      auVar16 = vpaddb_avx512bw(auVar16,auVar16);
      uVar7 = vpmovb2m_avx512bw(auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      uVar8 = vpmovb2m_avx512bw(auVar13);
      auVar13 = vpaddb_avx512bw(auVar13,auVar13);
      uVar9 = vpmovb2m_avx512bw(auVar14);
      auVar14 = vpaddb_avx512bw(auVar14,auVar14);
      *(int *)((long)flags + lVar4 + -4) =
           (int)POPCOUNT(uVar8) + (int)POPCOUNT(uVar6) + *(int *)((long)flags + lVar4 + -4);
      *(int *)((long)flags + lVar4 + 0x1c) =
           (int)POPCOUNT(uVar9) + (int)POPCOUNT(uVar7) + *(int *)((long)flags + lVar4 + 0x1c);
    }
  }
  while (uVar1 = uVar5 + 2, uVar1 <= len >> 5) {
    auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20 + 0x20));
    auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20));
    lVar4 = 0x20;
    auVar14 = vpsllw_avx512bw(auVar12,8);
    auVar12 = vpsrlw_avx512bw(auVar12,8);
    auVar14 = vpternlogd_avx512f(auVar14,auVar13,auVar10,0xf8);
    auVar12 = vpternlogd_avx512f(auVar12,auVar13,auVar11,0xf8);
    for (; uVar5 = uVar1, lVar4 != 0; lVar4 = lVar4 + -4) {
      uVar6 = vpmovb2m_avx512bw(auVar14);
      auVar14 = vpaddb_avx512bw(auVar14,auVar14);
      uVar7 = vpmovb2m_avx512bw(auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      piVar2 = (int *)((long)flags + lVar4 + -4);
      *piVar2 = *piVar2 + (int)POPCOUNT(uVar6);
      piVar2 = (int *)((long)flags + lVar4 + 0x1c);
      *piVar2 = *piVar2 + (int)POPCOUNT(uVar7);
    }
  }
  for (uVar5 = uVar5 << 5; uVar5 < len; uVar5 = uVar5 + 1) {
    uVar3 = data[uVar5];
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      flags[lVar4] = flags[lVar4] + (uint)((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt_unroll4(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m512i v##p = _mm512_loadu_si512(data_vectors+i+p);
        L(0) L(1) L(2) L(3)

#define U0(p,k) __m512i input##p = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v##k, 8), AND_OR);
#define U1(p,k) __m512i input##k = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16((int16_t)0xFF00), _mm512_srli_epi16(v##k, 8), AND_OR);
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm512_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}